

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::UpdateBuffer
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,IBuffer *pBuffer,Uint64 Offset,
          Uint64 Size,void *pData,RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)

{
  String *__return_storage_ptr__;
  bool bVar1;
  COMMAND_QUEUE_TYPE CVar2;
  Char *pCVar3;
  RenderPassVkImpl *pRVar4;
  BufferVkImpl *this_00;
  BufferDesc *Args;
  COMMAND_QUEUE_TYPE Type;
  char *pcVar5;
  undefined7 in_register_00000089;
  char (*Args_3) [8];
  char (*in_stack_fffffffffffffe28) [2];
  char (*in_stack_fffffffffffffe38) [2];
  long local_178;
  undefined1 local_170 [8];
  string msg_7;
  string msg_6;
  string msg_5;
  BufferDesc *BuffDesc;
  string msg_4;
  string msg_3;
  undefined1 local_a8 [8];
  string msg_2;
  string msg_1;
  undefined1 local_58 [8];
  string msg;
  RESOURCE_STATE_TRANSITION_MODE StateTransitionMode_local;
  void *pData_local;
  Uint64 Size_local;
  Uint64 Offset_local;
  IBuffer *pBuffer_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  Args_3 = (char (*) [8])CONCAT71(in_register_00000089,StateTransitionMode);
  msg.field_2._M_local_buf[0xf] = StateTransitionMode;
  Size_local = Offset;
  Offset_local = (Uint64)pBuffer;
  pBuffer_local = (IBuffer *)this;
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    bVar1 = IsDeferred(this);
    if (!bVar1) {
      FormatString<char[79]>
                ((string *)local_58,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"UpdateBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x6b8);
      std::__cxx11::string::~string((string *)local_58);
    }
    FormatString<char[97]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6b8);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  CVar2 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_TRANSFER);
  if (CVar2 != COMMAND_QUEUE_TYPE_TRANSFER) {
    __return_storage_ptr__ = (String *)((long)&msg_3.field_2 + 8);
    GetCommandQueueTypeString_abi_cxx11_
              (__return_storage_ptr__,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
    pcVar5 = " queue.";
    FormatString<char[13],char[22],std::__cxx11::string,char[8]>
              ((string *)local_a8,(Diligent *)0xc30f92,(char (*) [13])0xcc2999,
               (char (*) [22])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",Args_3
              );
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6b8);
    std::__cxx11::string::~string((string *)local_a8);
    pData = pcVar5;
  }
  if (Offset_local == 0) {
    FormatString<char[24]>((string *)((long)&msg_4.field_2 + 8),(char (*) [24])0xcc4807);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6b9);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  pRVar4 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                     ((RefCntAutoPtr *)&this->m_pActiveRenderPass);
  if (pRVar4 != (RenderPassVkImpl *)0x0) {
    FormatString<char[58]>
              ((string *)&BuffDesc,
               (char (*) [58])"UpdateBuffer command must be used outside of render pass.");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6ba);
    std::__cxx11::string::~string((string *)&BuffDesc);
  }
  this_00 = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>((IBuffer *)Offset_local);
  Args = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>::
         GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                  *)this_00);
  if ((Args->Usage != USAGE_DEFAULT) && (Args->Usage != USAGE_SPARSE)) {
    FormatString<char[26],char_const*,char[79]>
              ((string *)((long)&msg_6.field_2 + 8),(Diligent *)"Unable to update buffer \'",
               (char (*) [26])Args,
               (char **)
               "\': only USAGE_DEFAULT or USAGE_SPARSE buffers can be updated with UpdateData()",
               (char (*) [79])pData);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6be);
    std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
  }
  if (Args->Size <= Size_local) {
    FormatString<char[26],char_const*,char[12],unsigned_long,char[28],unsigned_long,char[2]>
              ((string *)((long)&msg_7.field_2 + 8),(Diligent *)"Unable to update buffer \'",
               (char (*) [26])Args,(char **)"\': offset (",(char (*) [12])&Size_local,
               (unsigned_long *)") exceeds the buffer size (",(char (*) [28])&Args->Size,
               (unsigned_long *)0xcabce5,in_stack_fffffffffffffe28);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6bf);
    std::__cxx11::string::~string((string *)(msg_7.field_2._M_local_buf + 8));
  }
  if (Args->Size < Size + Size_local) {
    local_178 = Size + Size_local;
    FormatString<char[26],char_const*,char[19],unsigned_long,char[2],unsigned_long,char[30],unsigned_long,char[2]>
              ((string *)local_170,(Diligent *)"Unable to update buffer \'",(char (*) [26])Args,
               (char **)"\': Update region [",(char (*) [19])&Size_local,(unsigned_long *)0xc684d7,
               (char (*) [2])&local_178,(unsigned_long *)") is out of buffer bounds [0,",
               (char (*) [30])&Args->Size,(unsigned_long *)0xcabce5,in_stack_fffffffffffffe38);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6c0);
    std::__cxx11::string::~string((string *)local_170);
  }
  (this->m_Stats).CommandCounters.UpdateBuffer = (this->m_Stats).CommandCounters.UpdateBuffer + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::UpdateBuffer(
    IBuffer*                       pBuffer,
    Uint64                         Offset,
    Uint64                         Size,
    const void*                    pData,
    RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_TRANSFER, "UpdateBuffer");
    DEV_CHECK_ERR(pBuffer != nullptr, "Buffer must not be null");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "UpdateBuffer command must be used outside of render pass.");
#ifdef DILIGENT_DEVELOPMENT
    {
        const BufferDesc& BuffDesc = ClassPtrCast<BufferImplType>(pBuffer)->GetDesc();
        DEV_CHECK_ERR(BuffDesc.Usage == USAGE_DEFAULT || BuffDesc.Usage == USAGE_SPARSE, "Unable to update buffer '", BuffDesc.Name, "': only USAGE_DEFAULT or USAGE_SPARSE buffers can be updated with UpdateData()");
        DEV_CHECK_ERR(Offset < BuffDesc.Size, "Unable to update buffer '", BuffDesc.Name, "': offset (", Offset, ") exceeds the buffer size (", BuffDesc.Size, ")");
        DEV_CHECK_ERR(Size + Offset <= BuffDesc.Size, "Unable to update buffer '", BuffDesc.Name, "': Update region [", Offset, ",", Size + Offset, ") is out of buffer bounds [0,", BuffDesc.Size, ")");
    }
#endif

    ++m_Stats.CommandCounters.UpdateBuffer;
}